

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license.cpp
# Opt level: O1

void __thiscall license::License::write_license(License *this)

{
  pointer pcVar1;
  char cVar2;
  SI_Error SVar3;
  int iVar4;
  runtime_error *prVar5;
  _Rb_tree_node_base *p_Var6;
  const_iterator cVar7;
  ostream *poVar8;
  long *plVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  pointer pbVar11;
  is_classifiedF *IsSpace;
  long *plVar12;
  _Base_ptr *pp_Var13;
  _Rb_tree_node_base *p_Var14;
  _Self __tmp;
  string *psVar15;
  unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_> crypto;
  string features;
  path license_name;
  string feature;
  path parentPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  feature_v;
  string license_for_sign;
  ifstream previous_license;
  ofstream license_stream;
  allocator local_619;
  long *local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  undefined1 local_5f0 [8];
  size_type local_5e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5e0;
  long *local_5d0;
  long local_5c8;
  long local_5c0;
  long lStack_5b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_5b0;
  long local_5a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  _Rb_tree_node_base *local_570;
  locale local_568 [8];
  locale local_560 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_538;
  string *local_518;
  ios_base *local_510;
  pointer local_508;
  pointer local_500;
  _Rb_tree_node_base *local_4f8;
  anon_union_16_2_ba345be5_for_m_Storage local_4f0;
  ulong local_4e0;
  undefined1 local_4d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  undefined1 local_4b8 [16];
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> local_4a8;
  undefined1 local_438 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  _Alloc_hider local_418;
  char local_408 [80];
  ios_base aiStack_3b8 [392];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230);
  local_4a8.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4a8.m_data._M_t._M_impl.super__Rb_tree_header._M_header;
  local_4a8.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4a8.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4a8.m_pData = (char *)0x0;
  local_4a8.m_uDataLen = 0;
  local_4a8.m_pFileComment = (char *)0x0;
  local_4a8.m_data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4a8.m_strings.
  super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_4a8.m_strings;
  local_4a8.m_strings.
  super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
  ._M_impl._M_node._M_size._0_7_ = 0;
  local_4a8._95_4_ = 0;
  local_4a8.m_bSpaces = true;
  local_4a8.m_nOrder = 0;
  local_4a8.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4a8.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_4a8.m_strings.
  super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_4a8.m_strings.
       super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  if (this->m_license_fname == (string *)0x0) {
    psVar15 = (string *)&std::cout;
  }
  else {
    std::ifstream::ifstream(local_438,(string *)this->m_license_fname,_S_in);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      pcVar1 = (this->m_license_fname->_M_dataplus)._M_p;
      local_5d0 = &local_5c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_5d0,pcVar1,pcVar1 + this->m_license_fname->_M_string_length);
      boost::filesystem::path::parent_path();
      if (local_590._M_string_length != 0) {
        boost::filesystem::detail::status((detail *)local_5f0,(path *)&local_590,(error_code *)0x0);
        if ((uint)local_5f0._0_4_ < 2) {
          cVar2 = boost::filesystem::detail::create_directories
                            ((path *)&local_590,(error_code *)0x0);
          if (cVar2 == '\0') {
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_558,"Cannot create licenses directory [",&local_590);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_558);
            local_5f0 = (undefined1  [8])*plVar9;
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar9 + 2);
            if (local_5f0 == (undefined1  [8])paVar10) {
              local_5e0._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_5e0._8_8_ = plVar9[3];
              local_5f0 = (undefined1  [8])&local_5e0;
            }
            else {
              local_5e0._M_allocated_capacity = paVar10->_M_allocated_capacity;
            }
            local_5e8 = plVar9[1];
            *plVar9 = (long)paVar10;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::runtime_error::runtime_error(prVar5,(string *)local_5f0);
            __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        else {
          boost::filesystem::detail::status
                    ((detail *)local_5f0,(path *)&local_590,(error_code *)0x0);
          if (local_5f0._0_4_ == 2) {
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_558,"trying to create folder [",&local_590);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_558);
            local_5f0 = (undefined1  [8])*plVar9;
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar9 + 2);
            if (local_5f0 == (undefined1  [8])paVar10) {
              local_5e0._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_5e0._8_8_ = plVar9[3];
              local_5f0 = (undefined1  [8])&local_5e0;
            }
            else {
              local_5e0._M_allocated_capacity = paVar10->_M_allocated_capacity;
            }
            local_5e8 = plVar9[1];
            *plVar9 = (long)paVar10;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::runtime_error::runtime_error(prVar5,(string *)local_5f0);
            __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_590._M_dataplus._M_p != &local_590.field_2) {
        operator_delete(local_590._M_dataplus._M_p);
      }
      if (local_5d0 != &local_5c0) {
        operator_delete(local_5d0);
      }
    }
    else {
      SVar3 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadData
                        (&local_4a8,(istream *)local_438);
      if (SVar3 != SI_OK) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar5,
                   "License file existing, but there were errors in loading it. Is it a license file?"
                  );
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    psVar15 = (string *)&local_230;
    std::ofstream::open(psVar15,(_Ios_Openmode)this->m_license_fname);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_590,"Can not create file [",this->m_license_fname);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_590);
      local_5d0 = (long *)*plVar9;
      plVar12 = plVar9 + 2;
      if (local_5d0 == plVar12) {
        local_5c0 = *plVar12;
        lStack_5b8 = plVar9[3];
        local_5d0 = &local_5c0;
      }
      else {
        local_5c0 = *plVar12;
      }
      local_5c8 = plVar9[1];
      *plVar9 = (long)plVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::runtime_error::runtime_error(prVar5,(string *)&local_5d0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::ifstream::~ifstream(local_438);
  }
  std::locale::locale((locale *)local_438);
  pcVar1 = (this->m_feature_names)._M_dataplus._M_p;
  local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
  std::__cxx11::string::
  _M_construct<boost::iterators::transform_iterator<boost::algorithm::detail::to_upperF<char>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::use_default,boost::use_default>>
            ((string *)&local_610,pcVar1,(locale *)local_438,
             pcVar1 + (this->m_feature_names)._M_string_length);
  std::locale::~locale((locale *)local_438);
  local_538.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_538.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_538.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_438._0_8_ = ",";
  local_438._8_8_ = "";
  boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
            ((is_any_ofF<char> *)&local_4f0,(iterator_range<const_char_*> *)local_438);
  boost::algorithm::
  split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const&,boost::algorithm::detail::is_any_ofF<char>>
            (&local_538,&local_610,(is_any_ofF<char> *)&local_4f0,token_compress_off);
  if ((0x10 < local_4e0) && (local_4f0.m_dynSet != (set_value_type *)0x0)) {
    operator_delete__(local_4f0.m_dynSet);
  }
  local_518 = psVar15;
  CryptoHelper::getInstance();
  (**(code **)(*local_618 + 0x18))(local_618,&this->m_private_key);
  local_508 = local_538.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_538.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_538.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_570 = &(this->values_map)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_510 = aiStack_3b8;
    pbVar11 = local_538.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_5b0 = &local_5a0;
      pcVar1 = (pbVar11->_M_dataplus)._M_p;
      local_500 = pbVar11;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_5b0,pcVar1,pcVar1 + pbVar11->_M_string_length);
      CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::SetLongValue
                (&local_4a8,local_5b0->_M_local_buf,"lic_ver",200,(char *)0x0,false,false);
      p_Var6 = (this->values_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (p_Var6 != local_570) {
        do {
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_438,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(p_Var6 + 1));
          CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::AddEntry
                    (&local_4a8,local_5b0->_M_local_buf,(char *)local_438._0_8_,local_418._M_p,
                     (char *)0x0,false,true);
          if (local_418._M_p != local_438 + 0x30) {
            operator_delete(local_418._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_438 + 0x10)) {
            operator_delete((void *)local_438._0_8_);
          }
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
        } while (p_Var6 != local_570);
      }
      if (local_5b0 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
LAB_0017e75b:
        pp_Var13 = (_Base_ptr *)0x0;
      }
      else {
        local_438._0_8_ = local_5b0;
        local_438._8_8_ = (char *)0x0;
        local_428._M_allocated_capacity._0_4_ = 0;
        cVar7 = std::
                _Rb_tree<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>,_std::_Select1st<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>_>
                ::find(&local_4a8.m_data._M_t,(key_type *)local_438);
        if ((_Rb_tree_header *)cVar7._M_node == &local_4a8.m_data._M_t._M_impl.super__Rb_tree_header
           ) goto LAB_0017e75b;
        pp_Var13 = &cVar7._M_node[1]._M_right;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)local_438);
      std::locale::locale((locale *)&local_590);
      IsSpace = (is_classifiedF *)(local_5a8 + (long)local_5b0);
      local_5d0 = &local_5c0;
      std::__cxx11::string::
      _M_construct<boost::iterators::transform_iterator<boost::algorithm::detail::to_upperF<char>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::use_default,boost::use_default>>
                ((string *)&local_5d0,local_5b0,&local_590);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_438 + 0x10),(char *)local_5d0,local_5c8);
      if (local_5d0 != &local_5c0) {
        operator_delete(local_5d0);
      }
      std::locale::~locale((locale *)&local_590);
      p_Var6 = pp_Var13[3];
      p_Var14 = (_Rb_tree_node_base *)(pp_Var13 + 1);
      local_4f8 = p_Var14;
      if (p_Var6 != p_Var14) {
        do {
          std::__cxx11::string::string
                    ((string *)&local_5d0,*(char **)(p_Var6 + 1),(allocator *)&local_590);
          iVar4 = std::__cxx11::string::compare((char *)&local_5d0);
          if (iVar4 != 0) {
            std::locale::locale(local_560);
            local_5f0._0_2_ = 0x2000;
            std::locale::locale((locale *)&local_5e8,local_560);
            boost::algorithm::
            trim_copy_if<std::__cxx11::string,boost::algorithm::detail::is_classifiedF>
                      (&local_590,(algorithm *)&local_5d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5f0,IsSpace);
            std::locale::~locale((locale *)&local_5e8);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)(local_438 + 0x10),local_590._M_dataplus._M_p,
                                local_590._M_string_length);
            std::__cxx11::string::string((string *)&local_558,(char *)p_Var6[1]._M_right,&local_619)
            ;
            std::locale::locale(local_568);
            local_4d8._0_2_ = 0x2000;
            std::locale::locale((locale *)(local_4d8 + 8),local_568);
            boost::algorithm::
            trim_copy_if<std::__cxx11::string,boost::algorithm::detail::is_classifiedF>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5f0,(algorithm *)&local_558,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4d8,IsSpace);
            std::locale::~locale((locale *)(local_4d8 + 8));
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_5f0,local_5e8);
            if (local_5f0 != (undefined1  [8])&local_5e0) {
              operator_delete((void *)local_5f0);
            }
            std::locale::~locale(local_568);
            p_Var14 = local_4f8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_558._M_dataplus._M_p != &local_558.field_2) {
              operator_delete(local_558._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_590._M_dataplus._M_p != &local_590.field_2) {
              operator_delete(local_590._M_dataplus._M_p);
            }
            std::locale::~locale(local_560);
          }
          if (local_5d0 != &local_5c0) {
            operator_delete(local_5d0);
          }
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
        } while (p_Var6 != p_Var14);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_438);
      std::ios_base::~ios_base(local_510);
      (**(code **)(*local_618 + 0x28))((stringstream *)local_438,local_618,&local_4c8);
      CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::AddEntry
                (&local_4a8,local_5b0->_M_local_buf,"sig",(char *)local_438._0_8_,(char *)0x0,false,
                 true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_438 + 0x10)) {
        operator_delete((void *)local_438._0_8_);
      }
      if ((undefined1 *)local_4c8._M_allocated_capacity != local_4b8) {
        operator_delete((void *)local_4c8._M_allocated_capacity);
      }
      if (local_5b0 != &local_5a0) {
        operator_delete(local_5b0);
      }
      pbVar11 = local_500 + 1;
    } while (pbVar11 != local_508);
  }
  local_438._0_8_ = &PTR__OutputWriter_0051f2f8;
  local_438._8_8_ = local_518;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Save
            (&local_4a8,(OutputWriter *)local_438,true);
  if (local_618 != (long *)0x0) {
    (**(code **)(*local_618 + 0x38))();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_538);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610._M_dataplus._M_p != &local_610.field_2) {
    operator_delete(local_610._M_dataplus._M_p);
  }
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::~CSimpleIniTempl(&local_4a8);
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _get;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void License::write_license() {
	ofstream license_stream;
	ostream *output_license;
	CSimpleIniA ini;
	if (m_license_fname == nullptr) {
		output_license = &cout;
	} else {
		ifstream previous_license(*m_license_fname);
		if (previous_license.is_open()) {
			SI_Error error = ini.LoadData(previous_license);
			if (error != SI_Error::SI_OK) {
				throw runtime_error(
					"License file existing, but there were errors in loading it. Is it a license file?");
			}
		} else {
			// new license
			create_license_path(*m_license_fname);
		}
		output_license = &license_stream;
		license_stream.open(*m_license_fname, ios::trunc | ios::binary);
		if (!license_stream.is_open()) {
			throw runtime_error("Can not create file [" + *m_license_fname + "].");
		}
	}

	const string features = boost::to_upper_copy(m_feature_names);
	vector<string> feature_v;
	boost::algorithm::split(feature_v, features, boost::is_any_of(","));
	unique_ptr<CryptoHelper> crypto(CryptoHelper::getInstance());
	crypto->loadPrivateKey_file(m_private_key);

	for (const string feature : feature_v) {
		ini.SetLongValue(feature.c_str(), "lic_ver", LICENSE_FILE_VERSION);
		for (auto it : values_map) {
			ini.SetValue(feature.c_str(), it.first.c_str(), it.second.c_str());
		}
		const CSimpleIniA::TKeyVal *section = ini.GetSection(feature.c_str());
		string license_for_sign = print_for_sign(feature, section);
		const string signature = crypto->signString(license_for_sign);
		ini.SetValue(feature.c_str(), LICENSE_SIGNATURE, signature.c_str());
	}
	ini.Save(*output_license, true);
}